

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIsoSlow.c
# Opt level: O1

void Iso_ManPrintClasses(Iso_Man_t *p,int fVerbose,int fVeryVerbose)

{
  int iVar1;
  Iso_Obj_t *pIVar2;
  ulong uVar3;
  ulong uVar4;
  char *pcVar5;
  char *pcVar6;
  Vec_Ptr_t *pVVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  void *pvVar12;
  ulong uVar13;
  Iso_Obj_t *pIVar14;
  
  if (fVerbose != 0) {
    printf("Total objects =%7d.  Entries =%7d.  Classes =%7d.  Singles =%7d.\n",
           (ulong)(uint)p->nObjs,(ulong)(uint)p->nEntries,(ulong)(uint)p->nClasses,
           (ulong)(uint)p->nSingles);
  }
  if (fVeryVerbose != 0) {
    puts("Non-trivial classes:");
    pVVar7 = p->vClasses;
    if (0 < pVVar7->nSize) {
      lVar11 = 0;
      do {
        pIVar14 = (Iso_Obj_t *)pVVar7->pArray[lVar11];
        printf("%5d : {");
        while (pIVar14 != (Iso_Obj_t *)0x0) {
          pIVar2 = p->pObjs;
          if ((pIVar14 <= pIVar2) || (pIVar2 + p->nObjs <= pIVar14)) {
            __assert_fail("pObj > p->pObjs && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigIsoSlow.c"
                          ,0x12d,"int Iso_ObjId(Iso_Man_t *, Iso_Obj_t *)");
          }
          lVar10 = ((long)pIVar14 - (long)pIVar2 >> 3) * -0x5555555555555555;
          pVVar7 = p->pAig->vObjs;
          if (pVVar7 == (Vec_Ptr_t *)0x0) {
            pvVar12 = (void *)0x0;
          }
          else {
            uVar9 = (uint)lVar10;
            if (((int)uVar9 < 0) || (pVVar7->nSize <= (int)uVar9)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            pvVar12 = pVVar7->pArray[uVar9 & 0x7fffffff];
          }
          if ((*(uint *)((long)pvVar12 + 0x18) & 7) - 7 < 0xfffffffe) {
            printf(" %d");
          }
          else {
            uVar3 = *(ulong *)((long)pvVar12 + 8);
            pcVar5 = "R,D tc;-R R5t* -Rt> t5*RD c>Rt- t;R,M t-RM; t;V,R V-tR; t5*lR l-t>R t5VR* -";
            if ((uVar3 & 1) == 0) {
              pcVar5 = "3jF j3&F Tj#3F &3sF 3(#F &3+F 3BF#( +a&3F 3F.#( +8&3F #(F.B3 8a&+3F 3FK#( +"
              ;
            }
            uVar13 = 0xffffffff;
            uVar8 = 0xffffffff;
            if (uVar3 != 0) {
              uVar8 = (ulong)*(uint *)((uVar3 & 0xfffffffffffffffe) + 0x24);
            }
            uVar4 = *(ulong *)((long)pvVar12 + 0x10);
            pcVar6 = "R,D tc;-R R5t* -Rt> t5*RD c>Rt- t;R,M t-RM; t;V,R V-tR; t5*lR l-t>R t5VR* -";
            if ((uVar4 & 1) == 0) {
              pcVar6 = "3jF j3&F Tj#3F &3sF 3(#F &3+F 3BF#( +a&3F 3F.#( +8&3F #(F.B3 8a&+3F 3FK#( +"
              ;
            }
            if (uVar4 != 0) {
              uVar13 = (ulong)*(uint *)((uVar4 & 0xfffffffffffffffe) + 0x24);
            }
            printf(" %d{%s%d(%d),%s%d(%d)}",lVar10,pcVar5 + 0x4a,uVar8,
                   (ulong)(*(uint *)((uVar3 & 0xfffffffffffffffe) + 0x1c) & 0xffffff),pcVar6 + 0x4a,
                   uVar13,(ulong)(*(uint *)((uVar4 & 0xfffffffffffffffe) + 0x1c) & 0xffffff));
          }
          printf("(%d)",(ulong)(*(uint *)pIVar14 & 0x3fffffff));
          iVar1 = pIVar14->iClass;
          if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) {
            __assert_fail("i >= 0 && i < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigIsoSlow.c"
                          ,300,"Iso_Obj_t *Iso_ManObj(Iso_Man_t *, int)");
          }
          if (iVar1 == 0) {
            pIVar14 = (Iso_Obj_t *)0x0;
          }
          else {
            pIVar14 = p->pObjs + iVar1;
          }
        }
        puts(" }");
        lVar11 = lVar11 + 1;
        pVVar7 = p->vClasses;
      } while (lVar11 < pVVar7->nSize);
    }
  }
  return;
}

Assistant:

void Iso_ManPrintClasses( Iso_Man_t * p, int fVerbose, int fVeryVerbose )
{
    int fOnlyCis = 0;
    Iso_Obj_t * pIso, * pTemp;
    int i;

    // count unique objects
    if ( fVerbose )
        printf( "Total objects =%7d.  Entries =%7d.  Classes =%7d.  Singles =%7d.\n", 
            p->nObjs, p->nEntries, p->nClasses, p->nSingles );

    if ( !fVeryVerbose )
        return;

    printf( "Non-trivial classes:\n" );
    Vec_PtrForEachEntry( Iso_Obj_t *, p->vClasses, pIso, i )
    {
        if ( fOnlyCis && pIso->Level > 0 )
            continue;

        printf( "%5d : {", i );
        for ( pTemp = pIso; pTemp; pTemp = Iso_ManObj(p, pTemp->iClass) )
        {
            if ( fOnlyCis )
                printf( " %d", Aig_ObjCioId( Iso_AigObj(p, pTemp) ) );
            else
            {
                Aig_Obj_t * pObj = Iso_AigObj(p, pTemp);
                if ( Aig_ObjIsNode(pObj) )
                    printf( " %d{%s%d(%d),%s%d(%d)}", Iso_ObjId(p, pTemp), 
                        Aig_ObjFaninC0(pObj)? "-": "+", Aig_ObjFaninId0(pObj), Aig_ObjLevel(Aig_ObjFanin0(pObj)), 
                        Aig_ObjFaninC1(pObj)? "-": "+", Aig_ObjFaninId1(pObj), Aig_ObjLevel(Aig_ObjFanin1(pObj)) );
                else
                    printf( " %d", Iso_ObjId(p, pTemp) );
            }
            printf( "(%d)", pTemp->Level );
        }        
        printf( " }\n" );
    }
}